

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall
TCMallocImplementation::GetFreeListSizes
          (TCMallocImplementation *this,
          vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_> *v)

{
  uint uVar1;
  int iVar2;
  SizeMap *pSVar3;
  CentralFreeList *pCVar4;
  SpinLock *pSVar5;
  PageHeap *pPVar6;
  undefined1 local_d50 [8];
  FreeListInfo i_2;
  undefined1 auStack_d28 [4];
  int s;
  FreeListInfo span_info;
  SpinLockHolder h_1;
  LargeSpanStats large;
  SmallSpanStats small;
  FreeListInfo i_1;
  int cl_1;
  uint64_t local_4b8;
  uint64_t thread_bytes;
  SpinLockHolder h;
  uint64_t class_count [128];
  undefined1 local_a0 [8];
  FreeListInfo i;
  size_t class_size;
  long lStack_70;
  int cl;
  int64_t prev_class_size;
  vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_> *v_local;
  TCMallocImplementation *this_local;
  
  std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::clear
            (v);
  lStack_70 = 0;
  class_size._4_4_ = 1;
  while( true ) {
    uVar1 = tcmalloc::Static::num_size_classes();
    if (uVar1 <= class_size._4_4_) break;
    pSVar3 = tcmalloc::Static::sizemap();
    i.min_object_size = (size_t)pSVar3->class_to_size_[class_size._4_4_];
    local_a0 = (undefined1  [8])(lStack_70 + 1);
    i.type = (char *)i.min_object_size;
    pCVar4 = tcmalloc::Static::central_cache();
    iVar2 = tcmalloc::CentralFreeList::length(pCVar4 + (int)class_size._4_4_);
    i.max_object_size = (long)iVar2 * (long)i.type;
    i.total_bytes_free = (size_t)GetFreeListSizes::kCentralCacheType;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)local_a0);
    pCVar4 = tcmalloc::Static::central_cache();
    iVar2 = tcmalloc::CentralFreeList::tc_length(pCVar4 + (int)class_size._4_4_);
    i.max_object_size = (long)iVar2 * (long)i.type;
    i.total_bytes_free = (size_t)GetFreeListSizes::kTransferCacheType;
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)local_a0);
    pSVar3 = tcmalloc::Static::sizemap();
    lStack_70 = (long)pSVar3->class_to_size_[class_size._4_4_];
    class_size._4_4_ = class_size._4_4_ + 1;
  }
  memset(&h,0,0x400);
  pSVar5 = tcmalloc::Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&thread_bytes,pSVar5);
  local_4b8 = 0;
  tcmalloc::ThreadCache::GetThreadStats(&local_4b8,(uint64_t *)&h);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&thread_bytes);
  lStack_70 = 0;
  i_1.type._0_4_ = 1;
  while( true ) {
    uVar1 = tcmalloc::Static::num_size_classes();
    if (uVar1 <= (uint)i_1.type) break;
    small.returned_length[0x7f] = lStack_70 + 1;
    tcmalloc::Static::sizemap();
    tcmalloc::Static::sizemap();
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)(small.returned_length + 0x7f));
    pSVar3 = tcmalloc::Static::sizemap();
    lStack_70 = (long)pSVar3->class_to_size_[(uint)i_1.type];
    i_1.type._0_4_ = (uint)i_1.type + 1;
  }
  pSVar5 = tcmalloc::Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&span_info.type,pSVar5);
  pPVar6 = tcmalloc::Static::pageheap();
  tcmalloc::PageHeap::GetSmallSpanStatsLocked(pPVar6,(SmallSpanStats *)&large.returned_pages);
  pPVar6 = tcmalloc::Static::pageheap();
  tcmalloc::PageHeap::GetLargeSpanStatsLocked(pPVar6,(LargeSpanStats *)&h_1);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&span_info.type);
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeSpanType;
  span_info.min_object_size = std::numeric_limits<unsigned_long>::max();
  _auStack_d28 = 0x100000;
  span_info.max_object_size = large.spans << 0xd;
  std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
  push_back(v,(value_type *)auStack_d28);
  span_info.total_bytes_free = (size_t)GetFreeListSizes::kLargeUnmappedSpanType;
  span_info.max_object_size = large.normal_pages << 0xd;
  std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
  push_back(v,(value_type *)auStack_d28);
  for (i_2.type._4_4_ = 1; i_2.type._4_4_ < 0x81; i_2.type._4_4_ = i_2.type._4_4_ + 1) {
    i_2.min_object_size = (size_t)(int)(i_2.type._4_4_ << 0xd);
    local_d50 = (undefined1  [8])(long)(int)((i_2.type._4_4_ - 1) * 0x2000);
    i_2.total_bytes_free = (size_t)GetFreeListSizes::kPageHeapType;
    i_2.max_object_size =
         (long)(int)(i_2.type._4_4_ << 0xd) *
         small.normal_length[(long)(int)(i_2.type._4_4_ - 1) + -1];
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)local_d50);
    i_2.total_bytes_free = (size_t)GetFreeListSizes::kPageHeapUnmappedType;
    i_2.max_object_size =
         (long)(int)(i_2.type._4_4_ << 0xd) *
         small.returned_length[(long)(int)(i_2.type._4_4_ - 1) + -1];
    std::vector<MallocExtension::FreeListInfo,_std::allocator<MallocExtension::FreeListInfo>_>::
    push_back(v,(value_type *)local_d50);
  }
  return;
}

Assistant:

virtual void GetFreeListSizes(std::vector<MallocExtension::FreeListInfo>* v) {
    static const char kCentralCacheType[] = "tcmalloc.central";
    static const char kTransferCacheType[] = "tcmalloc.transfer";
    static const char kThreadCacheType[] = "tcmalloc.thread";
    static const char kPageHeapType[] = "tcmalloc.page";
    static const char kPageHeapUnmappedType[] = "tcmalloc.page_unmapped";
    static const char kLargeSpanType[] = "tcmalloc.large";
    static const char kLargeUnmappedSpanType[] = "tcmalloc.large_unmapped";

    v->clear();

    // central class information
    int64_t prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      size_t class_size = Static::sizemap()->ByteSizeForClass(cl);
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = class_size;
      i.total_bytes_free =
          Static::central_cache()[cl].length() * class_size;
      i.type = kCentralCacheType;
      v->push_back(i);

      // transfer cache
      i.total_bytes_free =
          Static::central_cache()[cl].tc_length() * class_size;
      i.type = kTransferCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // Add stats from per-thread heaps
    uint64_t class_count[kClassSizesMax];
    memset(class_count, 0, sizeof(class_count));
    {
      SpinLockHolder h(Static::pageheap_lock());
      uint64_t thread_bytes = 0;
      ThreadCache::GetThreadStats(&thread_bytes, class_count);
    }

    prev_class_size = 0;
    for (int cl = 1; cl < Static::num_size_classes(); ++cl) {
      MallocExtension::FreeListInfo i;
      i.min_object_size = prev_class_size + 1;
      i.max_object_size = Static::sizemap()->ByteSizeForClass(cl);
      i.total_bytes_free =
          class_count[cl] * Static::sizemap()->ByteSizeForClass(cl);
      i.type = kThreadCacheType;
      v->push_back(i);

      prev_class_size = Static::sizemap()->ByteSizeForClass(cl);
    }

    // append page heap info
    PageHeap::SmallSpanStats small;
    PageHeap::LargeSpanStats large;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Static::pageheap()->GetSmallSpanStatsLocked(&small);
      Static::pageheap()->GetLargeSpanStatsLocked(&large);
    }

    // large spans: mapped
    MallocExtension::FreeListInfo span_info;
    span_info.type = kLargeSpanType;
    span_info.max_object_size = (std::numeric_limits<size_t>::max)();
    span_info.min_object_size = kMaxPages << kPageShift;
    span_info.total_bytes_free = large.normal_pages << kPageShift;
    v->push_back(span_info);

    // large spans: unmapped
    span_info.type = kLargeUnmappedSpanType;
    span_info.total_bytes_free = large.returned_pages << kPageShift;
    v->push_back(span_info);

    // small spans
    for (int s = 1; s <= kMaxPages; s++) {
      MallocExtension::FreeListInfo i;
      i.max_object_size = (s << kPageShift);
      i.min_object_size = ((s - 1) << kPageShift);

      i.type = kPageHeapType;
      i.total_bytes_free = (s << kPageShift) * small.normal_length[s - 1];
      v->push_back(i);

      i.type = kPageHeapUnmappedType;
      i.total_bytes_free = (s << kPageShift) * small.returned_length[s - 1];
      v->push_back(i);
    }
  }